

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O0

FT_Error pfr_load_bitmap_bits
                   (FT_Byte *p,FT_Byte *limit,FT_UInt format,FT_Bool decreasing,FT_Bitmap *target)

{
  undefined1 local_48 [8];
  PFR_BitWriterRec writer;
  FT_Error error;
  FT_Bitmap *target_local;
  FT_Bool decreasing_local;
  FT_UInt format_local;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  
  writer.total = 0;
  if ((target->rows != 0) && (target->width != 0)) {
    pfr_bitwriter_init((PFR_BitWriter)local_48,target,decreasing);
    if (format == 0) {
      pfr_bitwriter_decode_bytes((PFR_BitWriter)local_48,p,limit);
    }
    else if (format == 1) {
      pfr_bitwriter_decode_rle1((PFR_BitWriter)local_48,p,limit);
    }
    else if (format == 2) {
      pfr_bitwriter_decode_rle2((PFR_BitWriter)local_48,p,limit);
    }
  }
  return writer.total;
}

Assistant:

static FT_Error
  pfr_load_bitmap_bits( FT_Byte*    p,
                        FT_Byte*    limit,
                        FT_UInt     format,
                        FT_Bool     decreasing,
                        FT_Bitmap*  target )
  {
    FT_Error          error = FT_Err_Ok;
    PFR_BitWriterRec  writer;


    if ( target->rows > 0 && target->width > 0 )
    {
      pfr_bitwriter_init( &writer, target, decreasing );

      switch ( format )
      {
      case 0: /* packed bits */
        pfr_bitwriter_decode_bytes( &writer, p, limit );
        break;

      case 1: /* RLE1 */
        pfr_bitwriter_decode_rle1( &writer, p, limit );
        break;

      case 2: /* RLE2 */
        pfr_bitwriter_decode_rle2( &writer, p, limit );
        break;

      default:
        ;
      }
    }

    return error;
  }